

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O0

int __thiscall tchecker::parsing::program::parser_t::parse(parser_t *this)

{
  char cVar1;
  short sVar2;
  bool bVar3;
  symbol_kind_type sVar4;
  int iVar5;
  uint uVar6;
  binary_operator_t op;
  int iVar7;
  ostream *poVar8;
  stack_symbol_type *psVar9;
  shared_ptr<tchecker::nop_statement_t> *__args_2;
  shared_ptr<tchecker::statement_t> *psVar10;
  shared_ptr<tchecker::statement_t> *psVar11;
  element_type *peVar12;
  expression_t *peVar13;
  undefined4 extraout_var;
  binary_operator_t *pbVar14;
  shared_ptr<tchecker::expression_t> *psVar15;
  shared_ptr<tchecker::expression_t> *psVar16;
  shared_ptr<tchecker::lvalue_expression_t> *psVar17;
  shared_ptr<tchecker::var_expression_t> *psVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  longlong lVar19;
  out_of_range *this_00;
  int *piVar20;
  index_type iVar21;
  basic_symbol<tchecker::parsing::program::parser_t::by_state> *pbVar22;
  counter_type *local_dc0;
  stack_symbol_type *local_670;
  undefined1 local_668 [8];
  stack_symbol_type error_token;
  string msg;
  context yyctx;
  syntax_error *yyexc_1;
  exception *e_19;
  longlong l;
  exception *e_18;
  exception *e_17;
  exception *e_16;
  exception *e_15;
  shared_ptr<tchecker::binary_expression_t> local_568;
  exception *e_14;
  shared_ptr<tchecker::binary_expression_t> local_548;
  exception *e_13;
  shared_ptr<tchecker::binary_expression_t> local_528;
  exception *e_12;
  shared_ptr<tchecker::binary_expression_t> local_508;
  exception *e_11;
  shared_ptr<tchecker::binary_expression_t> local_4e8;
  exception *e_10;
  shared_ptr<tchecker::unary_expression_t> local_4c8;
  exception *e_9;
  exception *e_8;
  exception *e_7;
  exception *e_6;
  shared_ptr<tchecker::binary_expression_t> local_460;
  undefined1 local_450 [8];
  shared_ptr<tchecker::binary_expression_t> right;
  shared_ptr<tchecker::expression_t> middle_clone;
  string local_428;
  undefined1 local_408 [8];
  shared_ptr<tchecker::binary_expression_t> left;
  exception *e_5;
  exception *e_4;
  shared_ptr<tchecker::unary_expression_t> local_3d0;
  exception *e_3;
  shared_ptr<tchecker::binary_expression_t> local_3b0;
  exception *e_2;
  exception *e_1;
  shared_ptr<tchecker::nop_statement_t> local_370;
  shared_ptr<tchecker::local_array_statement_t> local_360;
  shared_ptr<tchecker::local_var_statement_t> local_350;
  shared_ptr<tchecker::local_var_statement_t> local_340;
  shared_ptr<tchecker::expression_t> local_330;
  shared_ptr<tchecker::expression_t> local_320;
  shared_ptr<tchecker::nop_statement_t> local_310;
  shared_ptr<tchecker::expression_t> local_300;
  exception *e;
  shared_ptr<tchecker::statement_t> local_2d8;
  shared_ptr<tchecker::expression_t> local_2c8;
  shared_ptr<tchecker::statement_t> local_2b8;
  shared_ptr<tchecker::expression_t> local_2a8;
  undefined1 local_298 [8];
  slice range;
  stack_symbol_type yylhs;
  syntax_error *yyexc;
  symbol_type yylookahead;
  int yyresult;
  undefined1 local_1a8 [8];
  stack_symbol_type yyerror_range [3];
  symbol_type yyla;
  int yyerrstatus_;
  int yynerrs_;
  int yylen;
  int yyn;
  parser_t *this_local;
  
  yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.column = 0;
  yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.line = 0;
  symbol_type::symbol_type
            ((symbol_type *)
             &yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
              location.end.line);
  local_670 = (stack_symbol_type *)local_1a8;
  do {
    stack_symbol_type::stack_symbol_type(local_670);
    local_670 = local_670 + 1;
  } while (local_670 !=
           (stack_symbol_type *)
           &yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
            location.end.line);
  if (this->yydebug_ != 0) {
    std::operator<<(this->yycdebug_,"Starting parse\n");
  }
  old_error_count = log_error_count();
  stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
  ::clear(&this->yystack_);
  yypush_(this,(char *)0x0,'\0',
          (symbol_type *)
          &yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
           location.end.line);
  while( true ) {
    if (this->yydebug_ != 0) {
      poVar8 = std::operator<<(this->yycdebug_,"Entering state ");
      psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,0);
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(int)(psVar9->
                                      super_basic_symbol<tchecker::parsing::program::parser_t::by_state>
                                      ).super_by_state.state);
      std::operator<<(poVar8,'\n');
    }
    if (this->yydebug_ != 0) {
      (*this->_vptr_parser_t[6])();
    }
    psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
             ::operator[](&this->yystack_,0);
    if ((psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).super_by_state.
        state == '(') break;
    psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
             ::operator[](&this->yystack_,0);
    sVar2 = *(short *)(yypact_ +
                      (long)(int)(psVar9->
                                 super_basic_symbol<tchecker::parsing::program::parser_t::by_state>)
                                 .super_by_state.state * 2);
    bVar3 = yy_pact_value_is_default_((int)sVar2);
    if (bVar3) {
LAB_00310f85:
      psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,0);
      yynerrs_ = (int)(char)yydefact_[(int)(psVar9->
                                           super_basic_symbol<tchecker::parsing::program::parser_t::by_state>
                                           ).super_by_state.state];
      if (yynerrs_ == 0) {
LAB_00314546:
        if (yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.line
            == 0) {
          yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.column
               = yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end
                 .column + 1;
          context::context((context *)((long)&msg.field_2 + 8),this,
                           (symbol_type *)
                           &yyerror_range[2].
                            super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                            location.end.line);
          (*this->_vptr_parser_t[4])
                    (&error_token.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>
                      .location.end.line,this,(undefined1 *)((long)&msg.field_2 + 8));
          (*this->_vptr_parser_t[3])
                    (this,&yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.
                           value.field_0x28,
                     &error_token.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>
                      .location.end.line);
          std::__cxx11::string::~string
                    ((string *)
                     &error_token.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>
                      .location.end.line);
        }
        yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value.
        _40_8_ = yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.value._40_8_
        ;
        yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .begin.filename =
             yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.begin.
             filename;
        yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .begin.line = yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.
                      location.begin.line;
        yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .begin.column =
             yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.begin.
             column;
        yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .end.filename =
             yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.
             filename;
        if (yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.line
            == 3) {
          sVar4 = by_kind::kind((by_kind *)
                                &yyerror_range[2].
                                 super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                                 location.end.line);
          if (sVar4 == S_YYEOF) {
LAB_00314908:
            yylookahead.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.
            end.line = 1;
            goto LAB_00314912;
          }
          bVar3 = basic_symbol<tchecker::parsing::program::parser_t::by_kind>::empty
                            ((basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)
                             &yyerror_range[2].
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              location.end.line);
          if (!bVar3) {
            yy_destroy_<tchecker::parsing::program::parser_t::by_kind>
                      (this,"Error: discarding",
                       (basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)
                       &yyerror_range[2].
                        super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
                        end.line);
            basic_symbol<tchecker::parsing::program::parser_t::by_kind>::clear
                      ((basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)
                       &yyerror_range[2].
                        super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
                        end.line);
          }
        }
        goto LAB_00314696;
      }
LAB_00310fca:
      iVar7 = (int)(char)yyr2_[yynerrs_];
      stack_symbol_type::stack_symbol_type((stack_symbol_type *)&range.range_);
      psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,(long)iVar7);
      range.range_._0_1_ =
           yy_lr_goto_state_((psVar9->
                             super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                             super_by_state.state,(int)(char)(&yyr1_)[yynerrs_]);
      switch((&yyr1_)[yynerrs_]) {
      case 0x1e:
      case 0x1f:
        value_type::emplace<std::__cxx11::string>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                    field_0x8);
        break;
      default:
        break;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
        value_type::emplace<std::shared_ptr<tchecker::statement_t>>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x31:
        value_type::emplace<std::shared_ptr<tchecker::expression_t>>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x30:
        value_type::emplace<tchecker::binary_operator_t>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x32:
        value_type::emplace<std::shared_ptr<tchecker::lvalue_expression_t>>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x33:
        value_type::emplace<std::shared_ptr<tchecker::var_expression_t>>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x34:
        value_type::emplace<int>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                    field_0x8);
      }
      stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
      ::slice::slice((slice *)local_298,&this->yystack_,(long)iVar7);
      if (iVar7 == 0) {
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::slice::operator[]((slice *)local_298,0);
        yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value._40_8_ =
             (psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location.
             end.filename;
        yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.begin.
        filename = *(filename_type **)
                    &(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                     location.end.line;
        yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.begin.
        _8_8_ = yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value.
                _40_8_;
        yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.
        filename = yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
                   .begin.filename;
      }
      else {
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::slice::operator[]((slice *)local_298,1);
        yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value._40_8_ =
             (psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location.
             begin.filename;
        yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.begin.
        filename = *(filename_type **)
                    &(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                     location.begin.line;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::slice::operator[]((slice *)local_298,(long)iVar7);
        yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.begin.
        _8_8_ = (psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                location.end.filename;
        yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.
        filename = *(filename_type **)
                    &(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                     location.end.line;
      }
      yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value.
      _40_8_ = yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value._40_8_
      ;
      yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
      begin.filename =
           yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.begin.
           filename;
      yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
      begin.line = yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
                   .begin.line;
      yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
      begin.column = yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                     location.begin.column;
      yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
      end.filename = yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                     location.end.filename;
      if (this->yydebug_ != 0) {
        (*this->_vptr_parser_t[5])(this,(ulong)(uint)yynerrs_);
      }
      switch(yynerrs_) {
      case 2:
        std::shared_ptr<tchecker::expression_t>::shared_ptr(&local_2a8,(nullptr_t)0x0);
        std::shared_ptr<tchecker::expression_t>::operator=(this->expr,&local_2a8);
        std::shared_ptr<tchecker::expression_t>::~shared_ptr(&local_2a8);
        uVar6 = log_error_count();
        if (old_error_count < uVar6) {
          std::shared_ptr<tchecker::statement_t>::shared_ptr(&local_2b8,(nullptr_t)0x0);
          std::shared_ptr<tchecker::statement_t>::operator=(this->stmt,&local_2b8);
          std::shared_ptr<tchecker::statement_t>::~shared_ptr(&local_2b8);
        }
        else {
          psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                              (&(psVar9->
                                super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                                value);
          std::shared_ptr<tchecker::statement_t>::operator=(this->stmt,psVar11);
        }
        break;
      case 3:
        uVar6 = log_error_count();
        if (old_error_count < uVar6) {
          std::shared_ptr<tchecker::expression_t>::shared_ptr(&local_2c8,(nullptr_t)0x0);
          std::shared_ptr<tchecker::expression_t>::operator=(this->expr,&local_2c8);
          std::shared_ptr<tchecker::expression_t>::~shared_ptr(&local_2c8);
        }
        else {
          psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                              (&(psVar9->
                                super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                                value);
          std::shared_ptr<tchecker::expression_t>::operator=(this->expr,psVar16);
        }
        std::shared_ptr<tchecker::statement_t>::shared_ptr(&local_2d8,(nullptr_t)0x0);
        std::shared_ptr<tchecker::statement_t>::operator=(this->stmt,&local_2d8);
        std::shared_ptr<tchecker::statement_t>::~shared_ptr(&local_2d8);
        break;
      default:
        break;
      case 6:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar10 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar10,psVar11);
        break;
      case 7:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::statement_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::sequence_statement_t,std::shared_ptr<tchecker::statement_t>&,std::shared_ptr<tchecker::statement_t>&>
                  ((shared_ptr<tchecker::statement_t> *)&e,psVar11);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=
                  (psVar11,(shared_ptr<tchecker::sequence_statement_t> *)&e);
        std::shared_ptr<tchecker::sequence_statement_t>::~shared_ptr
                  ((shared_ptr<tchecker::sequence_statement_t> *)&e);
        break;
      case 8:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar10 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar10,psVar11);
        break;
      case 9:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar10 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar10,psVar11);
        break;
      case 10:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar10 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar10,psVar11);
        break;
      case 0xb:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,3);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        __args_2 = (shared_ptr<tchecker::nop_statement_t> *)
                   value_type::as<std::shared_ptr<tchecker::statement_t>>
                             (&(psVar9->
                               super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                               value);
        std::make_shared<tchecker::nop_statement_t>();
        std::
        make_shared<tchecker::if_statement_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::statement_t>&,std::shared_ptr<tchecker::nop_statement_t>>
                  (&local_300,(shared_ptr<tchecker::statement_t> *)psVar16,__args_2);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=
                  (psVar11,(shared_ptr<tchecker::if_statement_t> *)&local_300);
        std::shared_ptr<tchecker::if_statement_t>::~shared_ptr
                  ((shared_ptr<tchecker::if_statement_t> *)&local_300);
        std::shared_ptr<tchecker::nop_statement_t>::~shared_ptr(&local_310);
        break;
      case 0xc:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,5);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,3);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        value_type::as<std::shared_ptr<tchecker::statement_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::if_statement_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::statement_t>&,std::shared_ptr<tchecker::statement_t>&>
                  (&local_320,(shared_ptr<tchecker::statement_t> *)psVar16,psVar11);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=
                  (psVar11,(shared_ptr<tchecker::if_statement_t> *)&local_320);
        std::shared_ptr<tchecker::if_statement_t>::~shared_ptr
                  ((shared_ptr<tchecker::if_statement_t> *)&local_320);
        break;
      case 0xd:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,3);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        value_type::as<std::shared_ptr<tchecker::statement_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::while_statement_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::statement_t>&>
                  (&local_330,(shared_ptr<tchecker::statement_t> *)psVar16);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=
                  (psVar11,(shared_ptr<tchecker::while_statement_t> *)&local_330);
        std::shared_ptr<tchecker::while_statement_t>::~shared_ptr
                  ((shared_ptr<tchecker::while_statement_t> *)&local_330);
        break;
      case 0xe:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::var_expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::local_var_statement_t,std::shared_ptr<tchecker::var_expression_t>&>
                  ((shared_ptr<tchecker::var_expression_t> *)&local_340);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar11,&local_340);
        std::shared_ptr<tchecker::local_var_statement_t>::~shared_ptr(&local_340);
        break;
      case 0xf:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar16 = (shared_ptr<tchecker::expression_t> *)
                  value_type::as<std::shared_ptr<tchecker::var_expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::local_var_statement_t,std::shared_ptr<tchecker::var_expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((shared_ptr<tchecker::var_expression_t> *)&local_350,psVar16);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar11,&local_350);
        std::shared_ptr<tchecker::local_var_statement_t>::~shared_ptr(&local_350);
        break;
      case 0x10:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,3);
        psVar16 = (shared_ptr<tchecker::expression_t> *)
                  value_type::as<std::shared_ptr<tchecker::var_expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::local_array_statement_t,std::shared_ptr<tchecker::var_expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((shared_ptr<tchecker::var_expression_t> *)&local_360,psVar16);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar11,&local_360);
        std::shared_ptr<tchecker::local_array_statement_t>::~shared_ptr(&local_360);
        break;
      case 0x11:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar10 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar10,psVar11);
        break;
      case 0x12:
        std::make_shared<tchecker::nop_statement_t>();
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar11,&local_370);
        std::shared_ptr<tchecker::nop_statement_t>::~shared_ptr(&local_370);
        break;
      case 0x13:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar10 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=(psVar10,psVar11);
        break;
      case 0x14:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar16 = (shared_ptr<tchecker::expression_t> *)
                  value_type::as<std::shared_ptr<tchecker::lvalue_expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::assign_statement_t,std::shared_ptr<tchecker::lvalue_expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((shared_ptr<tchecker::lvalue_expression_t> *)&e_1,psVar16);
        psVar11 = value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::statement_t>::operator=
                  (psVar11,(shared_ptr<tchecker::assign_statement_t> *)&e_1);
        std::shared_ptr<tchecker::assign_statement_t>::~shared_ptr
                  ((shared_ptr<tchecker::assign_statement_t> *)&e_1);
        break;
      case 0x15:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar15 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar15,psVar16);
        break;
      case 0x16:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar15 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar15,psVar16);
        break;
      case 0x17:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::make_shared<tchecker::par_expression_t,std::shared_ptr<tchecker::expression_t>&>
                  ((shared_ptr<tchecker::expression_t> *)&e_2);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=
                  (psVar16,(shared_ptr<tchecker::par_expression_t> *)&e_2);
        std::shared_ptr<tchecker::par_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::par_expression_t> *)&e_2);
        break;
      case 0x18:
        e_3._4_4_ = 0;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((binary_operator_t *)&local_3b0,
                   (shared_ptr<tchecker::expression_t> *)((long)&e_3 + 4),psVar16);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_3b0);
        std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr(&local_3b0);
        break;
      case 0x19:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar15 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar15,psVar16);
        break;
      case 0x1a:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar15 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar15,psVar16);
        break;
      case 0x1b:
        e_4._4_4_ = 1;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::unary_expression_t,tchecker::unary_operator_t,std::shared_ptr<tchecker::expression_t>&>
                  ((unary_operator_t *)&local_3d0,
                   (shared_ptr<tchecker::expression_t> *)((long)&e_4 + 4));
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_3d0);
        std::shared_ptr<tchecker::unary_expression_t>::~shared_ptr(&local_3d0);
        break;
      case 0x1c:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::make_shared<tchecker::par_expression_t,std::shared_ptr<tchecker::expression_t>&>
                  ((shared_ptr<tchecker::expression_t> *)&e_5);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=
                  (psVar16,(shared_ptr<tchecker::par_expression_t> *)&e_5);
        std::shared_ptr<tchecker::par_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::par_expression_t> *)&e_5);
        break;
      case 0x1d:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::dynamic_pointer_cast<tchecker::binary_expression_t,tchecker::expression_t>
                  ((shared_ptr<tchecker::expression_t> *)local_408);
        peVar12 = std::
                  __shared_ptr_access<tchecker::binary_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::binary_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_408);
        op = binary_expression_t::binary_operator(peVar12);
        bVar3 = is_less(op);
        if (bVar3) {
          psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,1);
          pbVar14 = value_type::as<tchecker::binary_operator_t>
                              (&(psVar9->
                                super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                                value);
          bVar3 = is_less(*pbVar14);
          if (!bVar3) goto LAB_003126a4;
          peVar12 = std::
                    __shared_ptr_access<tchecker::binary_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<tchecker::binary_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_408);
          peVar13 = binary_expression_t::right_operand(peVar12);
          iVar5 = (*peVar13->_vptr_expression_t[2])();
          std::shared_ptr<tchecker::expression_t>::shared_ptr<tchecker::expression_t,void>
                    ((shared_ptr<tchecker::expression_t> *)
                     &right.
                      super___shared_ptr<tchecker::binary_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(expression_t *)CONCAT44(extraout_var,iVar5));
          psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,1);
          psVar16 = (shared_ptr<tchecker::expression_t> *)
                    value_type::as<tchecker::binary_operator_t>
                              (&(psVar9->
                                super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                                value);
          psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          value_type::as<std::shared_ptr<tchecker::expression_t>>
                    (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                      value);
          std::
          make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t&,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                    ((binary_operator_t *)local_450,psVar16,
                     (shared_ptr<tchecker::expression_t> *)
                     &right.
                      super___shared_ptr<tchecker::binary_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          e_6._4_4_ = 0;
          std::
          make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::binary_expression_t>&,std::shared_ptr<tchecker::binary_expression_t>&>
                    ((binary_operator_t *)&local_460,
                     (shared_ptr<tchecker::binary_expression_t> *)((long)&e_6 + 4),
                     (shared_ptr<tchecker::binary_expression_t> *)local_408);
          psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                              ((value_type *)
                               &yylhs.
                                super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                                field_0x8);
          std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_460);
          std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr(&local_460);
          std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr
                    ((shared_ptr<tchecker::binary_expression_t> *)local_450);
          std::shared_ptr<tchecker::expression_t>::~shared_ptr
                    ((shared_ptr<tchecker::expression_t> *)
                     &right.
                      super___shared_ptr<tchecker::binary_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
LAB_003126a4:
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"Only < and <= are allowed in combined expressions",
                     (allocator<char> *)
                     ((long)&middle_clone.
                             super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
          error(this,(location_type *)
                     &yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value
                      .field_0x28,&local_428);
          std::__cxx11::string::~string((string *)&local_428);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&middle_clone.
                             super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
          psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                              ((value_type *)
                               &yylhs.
                                super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                                field_0x8);
          std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&fake_expression);
        }
        std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::binary_expression_t> *)local_408);
        break;
      case 0x1e:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar15 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar15,psVar16);
        break;
      case 0x1f:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        psVar16 = (shared_ptr<tchecker::expression_t> *)
                  value_type::as<tchecker::binary_operator_t>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar15 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t&,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((binary_operator_t *)&e_7,psVar16,psVar15);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=
                  (psVar16,(shared_ptr<tchecker::binary_expression_t> *)&e_7);
        std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::binary_expression_t> *)&e_7);
        break;
      case 0x20:
        pbVar14 = value_type::as<tchecker::binary_operator_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        *pbVar14 = EXPR_OP_EQ;
        break;
      case 0x21:
        pbVar14 = value_type::as<tchecker::binary_operator_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        *pbVar14 = EXPR_OP_NEQ;
        break;
      case 0x22:
        pbVar14 = value_type::as<tchecker::binary_operator_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        *pbVar14 = EXPR_OP_LT;
        break;
      case 0x23:
        pbVar14 = value_type::as<tchecker::binary_operator_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        *pbVar14 = EXPR_OP_LE;
        break;
      case 0x24:
        pbVar14 = value_type::as<tchecker::binary_operator_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        *pbVar14 = EXPR_OP_GE;
        break;
      case 0x25:
        pbVar14 = value_type::as<tchecker::binary_operator_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        *pbVar14 = EXPR_OP_GT;
        break;
      case 0x26:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<int>(&(psVar9->
                             super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                             value);
        std::make_shared<tchecker::int_expression_t,int&>((int *)&e_8);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=
                  (psVar16,(shared_ptr<tchecker::int_expression_t> *)&e_8);
        std::shared_ptr<tchecker::int_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::int_expression_t> *)&e_8);
        break;
      case 0x27:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar17 = value_type::as<std::shared_ptr<tchecker::lvalue_expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,psVar17);
        break;
      case 0x28:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::make_shared<tchecker::par_expression_t,std::shared_ptr<tchecker::expression_t>&>
                  ((shared_ptr<tchecker::expression_t> *)&e_9);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=
                  (psVar16,(shared_ptr<tchecker::par_expression_t> *)&e_9);
        std::shared_ptr<tchecker::par_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::par_expression_t> *)&e_9);
        break;
      case 0x29:
        e_10._4_4_ = 0;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::unary_expression_t,tchecker::unary_operator_t,std::shared_ptr<tchecker::expression_t>&>
                  ((unary_operator_t *)&local_4c8,
                   (shared_ptr<tchecker::expression_t> *)((long)&e_10 + 4));
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_4c8);
        std::shared_ptr<tchecker::unary_expression_t>::~shared_ptr(&local_4c8);
        break;
      case 0x2a:
        e_11._4_4_ = 8;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((binary_operator_t *)&local_4e8,
                   (shared_ptr<tchecker::expression_t> *)((long)&e_11 + 4),psVar16);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_4e8);
        std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr(&local_4e8);
        break;
      case 0x2b:
        e_12._4_4_ = 7;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((binary_operator_t *)&local_508,
                   (shared_ptr<tchecker::expression_t> *)((long)&e_12 + 4),psVar16);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_508);
        std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr(&local_508);
        break;
      case 0x2c:
        e_13._4_4_ = 9;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((binary_operator_t *)&local_528,
                   (shared_ptr<tchecker::expression_t> *)((long)&e_13 + 4),psVar16);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_528);
        std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr(&local_528);
        break;
      case 0x2d:
        e_14._4_4_ = 10;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((binary_operator_t *)&local_548,
                   (shared_ptr<tchecker::expression_t> *)((long)&e_14 + 4),psVar16);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_548);
        std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr(&local_548);
        break;
      case 0x2e:
        e_15._4_4_ = 0xb;
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((binary_operator_t *)&local_568,
                   (shared_ptr<tchecker::expression_t> *)((long)&e_15 + 4),psVar16);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=(psVar16,&local_568);
        std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr(&local_568);
        break;
      case 0x2f:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,5);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,3);
        psVar15 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::ite_expression_t,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((shared_ptr<tchecker::expression_t> *)&e_16,psVar16,psVar15);
        psVar16 = value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::expression_t>::operator=
                  (psVar16,(shared_ptr<tchecker::ite_expression_t> *)&e_16);
        std::shared_ptr<tchecker::ite_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::ite_expression_t> *)&e_16);
        break;
      case 0x30:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar18 = value_type::as<std::shared_ptr<tchecker::var_expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar17 = value_type::as<std::shared_ptr<tchecker::lvalue_expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::lvalue_expression_t>::operator=(psVar17,psVar18);
        break;
      case 0x31:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,3);
        psVar16 = (shared_ptr<tchecker::expression_t> *)
                  value_type::as<std::shared_ptr<tchecker::var_expression_t>>
                            (&(psVar9->
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                              value);
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        value_type::as<std::shared_ptr<tchecker::expression_t>>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::
        make_shared<tchecker::array_expression_t,std::shared_ptr<tchecker::var_expression_t>&,std::shared_ptr<tchecker::expression_t>&>
                  ((shared_ptr<tchecker::var_expression_t> *)&e_17,psVar16);
        psVar17 = value_type::as<std::shared_ptr<tchecker::lvalue_expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::lvalue_expression_t>::operator=
                  (psVar17,(shared_ptr<tchecker::array_expression_t> *)&e_17);
        std::shared_ptr<tchecker::array_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::array_expression_t> *)&e_17);
        break;
      case 0x32:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        value_type::as<std::__cxx11::string>
                  (&(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                    value);
        std::make_shared<tchecker::var_expression_t,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_18);
        psVar18 = value_type::as<std::shared_ptr<tchecker::var_expression_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::var_expression_t>::operator=
                  (psVar18,(shared_ptr<tchecker::var_expression_t> *)&e_18);
        std::shared_ptr<tchecker::var_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::var_expression_t> *)&e_18);
        break;
      case 0x33:
        psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        __str = value_type::as<std::__cxx11::string>
                          (&(psVar9->
                            super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                            value);
        lVar19 = std::__cxx11::stoll(__str,(size_t *)0x0,10);
        iVar5 = std::numeric_limits<int>::min();
        if ((lVar19 < iVar5) || (iVar5 = std::numeric_limits<int>::max(), iVar5 < lVar19)) {
          this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
          std::out_of_range::out_of_range(this_00,"");
          __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
        }
        piVar20 = value_type::as<int>((value_type *)
                                      &yylhs.
                                       super_basic_symbol<tchecker::parsing::program::parser_t::by_state>
                                       .field_0x8);
        *piVar20 = (int)lVar19;
      }
      if (this->yydebug_ != 0) {
        poVar8 = std::operator<<(this->yycdebug_,"-> $$ =");
        std::operator<<(poVar8,' ');
        yy_print_<tchecker::parsing::program::parser_t::by_state>
                  (this,this->yycdebug_,
                   (basic_symbol<tchecker::parsing::program::parser_t::by_state> *)&range.range_);
        std::operator<<(this->yycdebug_,'\n');
      }
      yypop_(this,iVar7);
      yypush_(this,(char *)0x0,(stack_symbol_type *)&range.range_);
      yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.column =
           0;
      stack_symbol_type::~stack_symbol_type((stack_symbol_type *)&range.range_);
      if (yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.
          column != 0) {
        if (yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.
            column != 0x13) goto LAB_00314ac1;
        yypop_(this,0);
        if (this->yydebug_ != 0) {
          (*this->_vptr_parser_t[6])();
        }
LAB_00314696:
        yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.line = 3
        ;
        while( true ) {
          psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          sVar2 = *(short *)(yypact_ +
                            (long)(int)(psVar9->
                                       super_basic_symbol<tchecker::parsing::program::parser_t::by_state>
                                       ).super_by_state.state * 2);
          bVar3 = yy_pact_value_is_default_((int)sVar2);
          if (((!bVar3) && (iVar7 = sVar2 + 1, -1 < iVar7)) &&
             ((iVar7 < 0xb3 &&
              ((yycheck_[iVar7] == '\x01' && (cVar1 = yytable_[iVar7], '\0' < cVar1)))))) break;
          iVar21 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                   ::size(&this->yystack_);
          if (iVar21 == 1) goto LAB_00314908;
          psVar9 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value.
          _40_8_ = (psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                   location.begin.filename;
          yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
          location.begin.filename =
               *(filename_type **)
                &(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                 location.begin.line;
          yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
          location.begin._8_8_ =
               (psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location
               .end.filename;
          yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
          location.end.filename =
               *(filename_type **)
                &(psVar9->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).
                 location.end.line;
          pbVar22 = &stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,0)->
                     super_basic_symbol<tchecker::parsing::program::parser_t::by_state>;
          yy_destroy_<tchecker::parsing::program::parser_t::by_state>(this,"Error: popping",pbVar22)
          ;
          yypop_(this,1);
          if (this->yydebug_ != 0) {
            (*this->_vptr_parser_t[6])();
          }
        }
        stack_symbol_type::stack_symbol_type((stack_symbol_type *)local_668);
        yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value.
        _40_8_ = yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.value._40_8_
        ;
        yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .begin.filename =
             yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.begin.
             filename;
        yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .begin.line = yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.
                      location.begin.line;
        yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .begin.column =
             yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.begin.
             column;
        yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .end.filename =
             yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.
             filename;
        error_token.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.value._40_8_
             = yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
               value._40_8_;
        error_token.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
        begin.filename =
             yyerror_range[1].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
             location.begin.filename;
        error_token.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
        begin.line = yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location
                     .begin.line;
        error_token.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
        begin.column = yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.
                       location.begin.column;
        error_token.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.
        filename = yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.
                   end.filename;
        local_668[0] = cVar1;
        yypush_(this,"Shifting",(stack_symbol_type *)local_668);
        stack_symbol_type::~stack_symbol_type((stack_symbol_type *)local_668);
      }
    }
    else {
      bVar3 = basic_symbol<tchecker::parsing::program::parser_t::by_kind>::empty
                        ((basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)
                         &yyerror_range[2].
                          super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                          location.end.line);
      if (bVar3) {
        if (this->yydebug_ != 0) {
          std::operator<<(this->yycdebug_,"Reading a token\n");
        }
        ppyylex((symbol_type *)&yyexc,this->program_context,this->expr,this->stmt);
        basic_symbol<tchecker::parsing::program::parser_t::by_kind>::move
                  ((basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)
                   &yyerror_range[2].
                    super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.
                    line,(basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)&yyexc);
        symbol_type::~symbol_type((symbol_type *)&yyexc);
      }
      if (this->yydebug_ != 0) {
        poVar8 = std::operator<<(this->yycdebug_,"Next token is");
        std::operator<<(poVar8,' ');
        yy_print_<tchecker::parsing::program::parser_t::by_kind>
                  (this,this->yycdebug_,
                   (basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)
                   &yyerror_range[2].
                    super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.
                    line);
        std::operator<<(this->yycdebug_,'\n');
      }
      sVar4 = by_kind::kind((by_kind *)
                            &yyerror_range[2].
                             super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                             location.end.line);
      if (sVar4 == S_YYerror) {
        yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location
        .end.line = 2;
        goto LAB_00314696;
      }
      sVar4 = by_kind::kind((by_kind *)
                            &yyerror_range[2].
                             super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                             location.end.line);
      iVar7 = sVar4 + sVar2;
      if (((iVar7 < 0) || (0xb2 < iVar7)) ||
         (cVar1 = yycheck_[iVar7],
         sVar4 = by_kind::kind((by_kind *)
                               &yyerror_range[2].
                                super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                                location.end.line), cVar1 != sVar4)) goto LAB_00310f85;
      iVar5 = (int)(char)yytable_[iVar7];
      if (iVar5 < 1) {
        bVar3 = yy_table_value_is_error_(iVar5);
        if (!bVar3) {
          yynerrs_ = -iVar5;
          goto LAB_00310fca;
        }
        goto LAB_00314546;
      }
      if (yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.line
          != 0) {
        yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.line =
             yyla.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.
             line + -1;
      }
      yypush_(this,"Shifting",yytable_[iVar7],
              (symbol_type *)
              &yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
               location.end.line);
    }
  }
  yylookahead.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.line =
       0;
LAB_00314912:
  bVar3 = basic_symbol<tchecker::parsing::program::parser_t::by_kind>::empty
                    ((basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)
                     &yyerror_range[2].
                      super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.
                      end.line);
  if (!bVar3) {
    yy_destroy_<tchecker::parsing::program::parser_t::by_kind>
              (this,"Cleanup: discarding lookahead",
               (basic_symbol<tchecker::parsing::program::parser_t::by_kind> *)
               &yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                location.end.line);
  }
  yypop_(this,0);
  if (this->yydebug_ != 0) {
    (*this->_vptr_parser_t[6])();
  }
  while (iVar21 = stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
                  ::size(&this->yystack_), 1 < iVar21) {
    pbVar22 = &stack<tchecker::parsing::program::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,0)->
               super_basic_symbol<tchecker::parsing::program::parser_t::by_state>;
    yy_destroy_<tchecker::parsing::program::parser_t::by_state>(this,"Cleanup: popping",pbVar22);
    yypop_(this,1);
  }
  this_local._4_4_ =
       yylookahead.super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>.location.end.
       line;
  yylhs.super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.location.end.column = 1;
LAB_00314ac1:
  local_dc0 = &yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
               location.end.line;
  do {
    local_dc0 = local_dc0 + -0x18;
    stack_symbol_type::~stack_symbol_type((stack_symbol_type *)local_dc0);
  } while (local_dc0 != (counter_type *)local_1a8);
  symbol_type::~symbol_type
            ((symbol_type *)
             &yyerror_range[2].super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
              location.end.line);
  return this_local._4_4_;
}

Assistant:

int
  parser_t::parse ()
  {
    int yyn;
    /// Length of the RHS of the rule being reduced.
    int yylen = 0;

    // Error handling.
    int yynerrs_ = 0;
    int yyerrstatus_ = 0;

    /// The lookahead symbol.
    symbol_type yyla;

    /// The locations where the error started and ended.
    stack_symbol_type yyerror_range[3];

    /// The return value of parse ().
    int yyresult;

#if YY_EXCEPTIONS
    try
#endif // YY_EXCEPTIONS
      {
    YYCDEBUG << "Starting parse\n";


    // User initialization code.
#line 96 "program.yy"
{
  old_error_count = tchecker::log_error_count();
}

#line 736 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"


    /* Initialize the stack.  The initial state will be set in
       yynewstate, since the latter expects the semantical and the
       location values to have been already stored, initialize these
       stacks with a primary value.  */
    yystack_.clear ();
    yypush_ (YY_NULLPTR, 0, YY_MOVE (yyla));

  /*-----------------------------------------------.
  | yynewstate -- push a new symbol on the stack.  |
  `-----------------------------------------------*/
  yynewstate:
    YYCDEBUG << "Entering state " << int (yystack_[0].state) << '\n';
    YY_STACK_PRINT ();

    // Accept?
    if (yystack_[0].state == yyfinal_)
      YYACCEPT;

    goto yybackup;


  /*-----------.
  | yybackup.  |
  `-----------*/
  yybackup:
    // Try to take a decision without lookahead.
    yyn = yypact_[+yystack_[0].state];
    if (yy_pact_value_is_default_ (yyn))
      goto yydefault;

    // Read a lookahead token.
    if (yyla.empty ())
      {
        YYCDEBUG << "Reading a token\n";
#if YY_EXCEPTIONS
        try
#endif // YY_EXCEPTIONS
          {
            symbol_type yylookahead (yylex (program_context, expr, stmt));
            yyla.move (yylookahead);
          }
#if YY_EXCEPTIONS
        catch (const syntax_error& yyexc)
          {
            YYCDEBUG << "Caught exception: " << yyexc.what() << '\n';
            error (yyexc);
            goto yyerrlab1;
          }
#endif // YY_EXCEPTIONS
      }
    YY_SYMBOL_PRINT ("Next token is", yyla);

    if (yyla.kind () == symbol_kind::S_YYerror)
    {
      // The scanner already issued an error message, process directly
      // to error recovery.  But do not keep the error token as
      // lookahead, it is too special and may lead us to an endless
      // loop in error recovery. */
      yyla.kind_ = symbol_kind::S_YYUNDEF;
      goto yyerrlab1;
    }

    /* If the proper action on seeing token YYLA.TYPE is to reduce or
       to detect an error, take that action.  */
    yyn += yyla.kind ();
    if (yyn < 0 || yylast_ < yyn || yycheck_[yyn] != yyla.kind ())
      {
        goto yydefault;
      }

    // Reduce or error.
    yyn = yytable_[yyn];
    if (yyn <= 0)
      {
        if (yy_table_value_is_error_ (yyn))
          goto yyerrlab;
        yyn = -yyn;
        goto yyreduce;
      }

    // Count tokens shifted since error; after three, turn off error status.
    if (yyerrstatus_)
      --yyerrstatus_;

    // Shift the lookahead token.
    yypush_ ("Shifting", state_type (yyn), YY_MOVE (yyla));
    goto yynewstate;


  /*-----------------------------------------------------------.
  | yydefault -- do the default action for the current state.  |
  `-----------------------------------------------------------*/
  yydefault:
    yyn = yydefact_[+yystack_[0].state];
    if (yyn == 0)
      goto yyerrlab;
    goto yyreduce;


  /*-----------------------------.
  | yyreduce -- do a reduction.  |
  `-----------------------------*/
  yyreduce:
    yylen = yyr2_[yyn];
    {
      stack_symbol_type yylhs;
      yylhs.state = yy_lr_goto_state_ (yystack_[yylen].state, yyr1_[yyn]);
      /* Variants are always initialized to an empty instance of the
         correct type. The default '$$ = $1' action is NOT applied
         when using variants.  */
      switch (yyr1_[yyn])
    {
      case symbol_kind::S_predicate_operator: // predicate_operator
        yylhs.value.emplace< enum tchecker::binary_operator_t > ();
        break;

      case symbol_kind::S_conjunctive_formula: // conjunctive_formula
      case symbol_kind::S_non_atomic_conjunctive_formula: // non_atomic_conjunctive_formula
      case symbol_kind::S_atomic_formula: // atomic_formula
      case symbol_kind::S_predicate_formula: // predicate_formula
      case symbol_kind::S_binary_formula: // binary_formula
      case symbol_kind::S_term: // term
        yylhs.value.emplace< std::shared_ptr<tchecker::expression_t> > ();
        break;

      case symbol_kind::S_lvalue_term: // lvalue_term
        yylhs.value.emplace< std::shared_ptr<tchecker::lvalue_expression_t> > ();
        break;

      case symbol_kind::S_sequence_statement: // sequence_statement
      case symbol_kind::S_statement: // statement
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_loop_statement: // loop_statement
      case symbol_kind::S_local_statement: // local_statement
      case symbol_kind::S_simple_statement: // simple_statement
      case symbol_kind::S_assignment: // assignment
        yylhs.value.emplace< std::shared_ptr<tchecker::statement_t> > ();
        break;

      case symbol_kind::S_variable_term: // variable_term
        yylhs.value.emplace< std::shared_ptr<tchecker::var_expression_t> > ();
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer"
        yylhs.value.emplace< std::string > ();
        break;

      case symbol_kind::S_integer: // integer
        yylhs.value.emplace< tchecker::integer_t > ();
        break;

      default:
        break;
    }


      // Default location.
      {
        stack_type::slice range (yystack_, yylen);
        YYLLOC_DEFAULT (yylhs.location, range, yylen);
        yyerror_range[1].location = yylhs.location;
      }

      // Perform the reduction.
      YY_REDUCE_PRINT (yyn);
#if YY_EXCEPTIONS
      try
#endif // YY_EXCEPTIONS
        {
          switch (yyn)
            {
  case 2: // program: sequence_statement
#line 184 "program.yy"
{ expr = nullptr;
  if (tchecker::log_error_count() > old_error_count)
    stmt = nullptr;
  else
    stmt = yystack_[0].value.as < std::shared_ptr<tchecker::statement_t> > ();
}
#line 919 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 3: // program: conjunctive_formula
#line 191 "program.yy"
{
  if (tchecker::log_error_count() > old_error_count)
    expr = nullptr;
  else
    expr = yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ();
  stmt = nullptr;
}
#line 931 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 6: // sequence_statement: statement opt_semicolon
#line 207 "program.yy"
{ yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = yystack_[1].value.as < std::shared_ptr<tchecker::statement_t> > (); }
#line 937 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 7: // sequence_statement: statement ";" sequence_statement
#line 209 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::sequence_statement_t>(yystack_[2].value.as < std::shared_ptr<tchecker::statement_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::statement_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = fake_statement;
  }
}
#line 951 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 8: // statement: simple_statement
#line 222 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::statement_t> > (); }
#line 957 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 9: // statement: if_statement
#line 224 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::statement_t> > (); }
#line 963 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 10: // statement: loop_statement
#line 226 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::statement_t> > (); }
#line 969 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 11: // if_statement: "if" conjunctive_formula "then" sequence_statement "end"
#line 231 "program.yy"
    {  yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::if_statement_t>(yystack_[3].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[1].value.as < std::shared_ptr<tchecker::statement_t> > (), std::make_shared<tchecker::nop_statement_t>()); }
#line 975 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 12: // if_statement: "if" conjunctive_formula "then" sequence_statement "else" sequence_statement "end"
#line 233 "program.yy"
    {  yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::if_statement_t>(yystack_[5].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[3].value.as < std::shared_ptr<tchecker::statement_t> > (), yystack_[1].value.as < std::shared_ptr<tchecker::statement_t> > ()); }
#line 981 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 13: // loop_statement: "while" conjunctive_formula "do" sequence_statement "end"
#line 238 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::while_statement_t>(yystack_[3].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[1].value.as < std::shared_ptr<tchecker::statement_t> > ()); }
#line 987 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 14: // local_statement: "local" variable_term
#line 243 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::local_var_statement_t>(yystack_[0].value.as < std::shared_ptr<tchecker::var_expression_t> > ()); }
#line 993 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 15: // local_statement: "local" variable_term "=" term
#line 245 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::local_var_statement_t>(yystack_[2].value.as < std::shared_ptr<tchecker::var_expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ()); }
#line 999 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 16: // local_statement: "local" variable_term "[" term "]"
#line 247 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::local_array_statement_t>(yystack_[3].value.as < std::shared_ptr<tchecker::var_expression_t> > (), yystack_[1].value.as < std::shared_ptr<tchecker::expression_t> > ()); }
#line 1005 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 17: // simple_statement: assignment
#line 252 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::statement_t> > (); }
#line 1011 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 18: // simple_statement: "nop"
#line 254 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::nop_statement_t>(); }
#line 1017 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 19: // simple_statement: local_statement
#line 256 "program.yy"
    { yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::statement_t> > (); }
#line 1023 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 20: // assignment: lvalue_term "=" term
#line 262 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = std::make_shared<tchecker::assign_statement_t>(yystack_[2].value.as < std::shared_ptr<tchecker::lvalue_expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::statement_t> > () = fake_statement;
  }
}
#line 1037 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 21: // conjunctive_formula: atomic_formula
#line 276 "program.yy"
{ yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > (); }
#line 1043 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 22: // conjunctive_formula: non_atomic_conjunctive_formula
#line 278 "program.yy"
{ yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > (); }
#line 1049 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 23: // non_atomic_conjunctive_formula: "(" non_atomic_conjunctive_formula ")"
#line 284 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::par_expression_t>(yystack_[1].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1063 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 24: // non_atomic_conjunctive_formula: atomic_formula "&&" conjunctive_formula
#line 294 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_LAND, yystack_[2].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1077 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 25: // atomic_formula: term
#line 308 "program.yy"
{ yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > (); }
#line 1083 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 26: // atomic_formula: predicate_formula
#line 310 "program.yy"
{ yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > (); }
#line 1089 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 27: // atomic_formula: "!" atomic_formula
#line 312 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::unary_expression_t>(tchecker::EXPR_OP_LNOT, yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1103 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 28: // predicate_formula: "(" predicate_formula ")"
#line 326 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::par_expression_t>(yystack_[1].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1117 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 29: // predicate_formula: binary_formula predicate_operator term
#line 336 "program.yy"
{
  try {
    auto left = std::dynamic_pointer_cast<tchecker::binary_expression_t>(yystack_[2].value.as < std::shared_ptr<tchecker::expression_t> > ());
    if (! tchecker::is_less(left->binary_operator()) || ! tchecker::is_less(yystack_[1].value.as < enum tchecker::binary_operator_t > ())) {
      tchecker::parsing::program::parser_t::error(yylhs.location, "Only < and <= are allowed in combined expressions");
      yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
    }
    else {
      std::shared_ptr<tchecker::expression_t> middle_clone{left->right_operand().clone()};
      auto right = std::make_shared<tchecker::binary_expression_t>(yystack_[1].value.as < enum tchecker::binary_operator_t > (), middle_clone, yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
      yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_LAND, left, right);
    }
  } 
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1140 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 30: // predicate_formula: binary_formula
#line 355 "program.yy"
{ yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > (); }
#line 1146 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 31: // binary_formula: term predicate_operator term
#line 361 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::binary_expression_t>(yystack_[1].value.as < enum tchecker::binary_operator_t > (), yystack_[2].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1160 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 32: // predicate_operator: "=="
#line 374 "program.yy"
          { yylhs.value.as < enum tchecker::binary_operator_t > () = tchecker::EXPR_OP_EQ; }
#line 1166 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 33: // predicate_operator: "!="
#line 375 "program.yy"
          { yylhs.value.as < enum tchecker::binary_operator_t > () = tchecker::EXPR_OP_NEQ; }
#line 1172 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 34: // predicate_operator: "<"
#line 376 "program.yy"
          { yylhs.value.as < enum tchecker::binary_operator_t > () = tchecker::EXPR_OP_LT; }
#line 1178 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 35: // predicate_operator: "<="
#line 377 "program.yy"
          { yylhs.value.as < enum tchecker::binary_operator_t > () = tchecker::EXPR_OP_LE; }
#line 1184 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 36: // predicate_operator: ">="
#line 378 "program.yy"
          { yylhs.value.as < enum tchecker::binary_operator_t > () = tchecker::EXPR_OP_GE; }
#line 1190 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 37: // predicate_operator: ">"
#line 379 "program.yy"
          { yylhs.value.as < enum tchecker::binary_operator_t > () = tchecker::EXPR_OP_GT; }
#line 1196 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 38: // term: integer
#line 385 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::int_expression_t>(yystack_[0].value.as < tchecker::integer_t > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1210 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 39: // term: lvalue_term
#line 395 "program.yy"
{ yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::lvalue_expression_t> > (); }
#line 1216 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 40: // term: "(" term ")"
#line 397 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::par_expression_t>(yystack_[1].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1230 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 41: // term: "-" term
#line 407 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::unary_expression_t>(tchecker::EXPR_OP_NEG, yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1244 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 42: // term: term "+" term
#line 417 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_PLUS, yystack_[2].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1258 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 43: // term: term "-" term
#line 427 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_MINUS, yystack_[2].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1272 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 44: // term: term "*" term
#line 437 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_TIMES, yystack_[2].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1286 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 45: // term: term "/" term
#line 447 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_DIV, yystack_[2].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1300 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 46: // term: term "%" term
#line 457 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_MOD, yystack_[2].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[0].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1314 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 47: // term: "(" "if" conjunctive_formula "then" term "else" term ")"
#line 467 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = std::make_shared<tchecker::ite_expression_t>(yystack_[5].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[3].value.as < std::shared_ptr<tchecker::expression_t> > (), yystack_[1].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::expression_t> > () = fake_expression;
  }
}
#line 1328 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 48: // lvalue_term: variable_term
#line 481 "program.yy"
{ yylhs.value.as < std::shared_ptr<tchecker::lvalue_expression_t> > () = yystack_[0].value.as < std::shared_ptr<tchecker::var_expression_t> > (); }
#line 1334 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 49: // lvalue_term: variable_term "[" term "]"
#line 483 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::lvalue_expression_t> > () = std::make_shared<tchecker::array_expression_t>(yystack_[3].value.as < std::shared_ptr<tchecker::var_expression_t> > (), yystack_[1].value.as < std::shared_ptr<tchecker::expression_t> > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::lvalue_expression_t> > () = fake_expression;
  }
}
#line 1348 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 50: // variable_term: "identifier"
#line 497 "program.yy"
{
  try {
    yylhs.value.as < std::shared_ptr<tchecker::var_expression_t> > () = std::make_shared<tchecker::var_expression_t>(yystack_[0].value.as < std::string > ());
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
    yylhs.value.as < std::shared_ptr<tchecker::var_expression_t> > () = fake_var_expression;
  }
}
#line 1362 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;

  case 51: // integer: "integer"
#line 511 "program.yy"
{
  try {
    long long l = std::stoll(yystack_[0].value.as < std::string > (), nullptr, 10);
    if ( (l < std::numeric_limits<integer_t>::min()) || (l > std::numeric_limits<integer_t>::max()) )
      throw std::out_of_range("");
    yylhs.value.as < tchecker::integer_t > () = static_cast<tchecker::integer_t>(l);
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yystack_[0].location << " value " << yystack_[0].value.as < std::string > () << " out of range ";
    std::cerr << std::numeric_limits<integer_t>::min() << "," << std::numeric_limits<integer_t>::max() << std::endl;
    yylhs.value.as < tchecker::integer_t > () = 0;
  }
}
#line 1380 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
    break;


#line 1384 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"

            default:
              break;
            }
        }
#if YY_EXCEPTIONS
      catch (const syntax_error& yyexc)
        {
          YYCDEBUG << "Caught exception: " << yyexc.what() << '\n';
          error (yyexc);
          YYERROR;
        }
#endif // YY_EXCEPTIONS
      YY_SYMBOL_PRINT ("-> $$ =", yylhs);
      yypop_ (yylen);
      yylen = 0;

      // Shift the result of the reduction.
      yypush_ (YY_NULLPTR, YY_MOVE (yylhs));
    }
    goto yynewstate;


  /*--------------------------------------.
  | yyerrlab -- here on detecting error.  |
  `--------------------------------------*/
  yyerrlab:
    // If not already recovering from an error, report this error.
    if (!yyerrstatus_)
      {
        ++yynerrs_;
        context yyctx (*this, yyla);
        std::string msg = yysyntax_error_ (yyctx);
        error (yyla.location, YY_MOVE (msg));
      }


    yyerror_range[1].location = yyla.location;
    if (yyerrstatus_ == 3)
      {
        /* If just tried and failed to reuse lookahead token after an
           error, discard it.  */

        // Return failure if at end of input.
        if (yyla.kind () == symbol_kind::S_YYEOF)
          YYABORT;
        else if (!yyla.empty ())
          {
            yy_destroy_ ("Error: discarding", yyla);
            yyla.clear ();
          }
      }

    // Else will try to reuse lookahead token after shifting the error token.
    goto yyerrlab1;


  /*---------------------------------------------------.
  | yyerrorlab -- error raised explicitly by YYERROR.  |
  `---------------------------------------------------*/
  yyerrorlab:
    /* Pacify compilers when the user code never invokes YYERROR and
       the label yyerrorlab therefore never appears in user code.  */
    if (false)
      YYERROR;

    /* Do not reclaim the symbols of the rule whose action triggered
       this YYERROR.  */
    yypop_ (yylen);
    yylen = 0;
    YY_STACK_PRINT ();
    goto yyerrlab1;


  /*-------------------------------------------------------------.
  | yyerrlab1 -- common code for both syntax error and YYERROR.  |
  `-------------------------------------------------------------*/
  yyerrlab1:
    yyerrstatus_ = 3;   // Each real token shifted decrements this.
    // Pop stack until we find a state that shifts the error token.
    for (;;)
      {
        yyn = yypact_[+yystack_[0].state];
        if (!yy_pact_value_is_default_ (yyn))
          {
            yyn += symbol_kind::S_YYerror;
            if (0 <= yyn && yyn <= yylast_
                && yycheck_[yyn] == symbol_kind::S_YYerror)
              {
                yyn = yytable_[yyn];
                if (0 < yyn)
                  break;
              }
          }

        // Pop the current state because it cannot handle the error token.
        if (yystack_.size () == 1)
          YYABORT;

        yyerror_range[1].location = yystack_[0].location;
        yy_destroy_ ("Error: popping", yystack_[0]);
        yypop_ ();
        YY_STACK_PRINT ();
      }
    {
      stack_symbol_type error_token;

      yyerror_range[2].location = yyla.location;
      YYLLOC_DEFAULT (error_token.location, yyerror_range, 2);

      // Shift the error token.
      error_token.state = state_type (yyn);
      yypush_ ("Shifting", YY_MOVE (error_token));
    }
    goto yynewstate;


  /*-------------------------------------.
  | yyacceptlab -- YYACCEPT comes here.  |
  `-------------------------------------*/
  yyacceptlab:
    yyresult = 0;
    goto yyreturn;


  /*-----------------------------------.
  | yyabortlab -- YYABORT comes here.  |
  `-----------------------------------*/
  yyabortlab:
    yyresult = 1;
    goto yyreturn;


  /*-----------------------------------------------------.
  | yyreturn -- parsing is finished, return the result.  |
  `-----------------------------------------------------*/
  yyreturn:
    if (!yyla.empty ())
      yy_destroy_ ("Cleanup: discarding lookahead", yyla);

    /* Do not reclaim the symbols of the rule whose action triggered
       this YYABORT or YYACCEPT.  */
    yypop_ (yylen);
    YY_STACK_PRINT ();
    while (1 < yystack_.size ())
      {
        yy_destroy_ ("Cleanup: popping", yystack_[0]);
        yypop_ ();
      }

    return yyresult;
  }
#if YY_EXCEPTIONS
    catch (...)
      {
        YYCDEBUG << "Exception caught: cleaning lookahead and stack\n";
        // Do not try to display the values of the reclaimed symbols,
        // as their printers might throw an exception.
        if (!yyla.empty ())
          yy_destroy_ (YY_NULLPTR, yyla);

        while (1 < yystack_.size ())
          {
            yy_destroy_ (YY_NULLPTR, yystack_[0]);
            yypop_ ();
          }
        throw;
      }
#endif // YY_EXCEPTIONS
  }